

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::RandomBernoulliStaticLayerParams::ByteSizeLong
          (RandomBernoulliStaticLayerParams *this)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  int64 iVar4;
  float fVar5;
  int cached_size;
  int cached_size_1;
  size_t data_size;
  size_t total_size;
  RandomBernoulliStaticLayerParams *this_local;
  
  data_size = 0;
  sVar2 = google::protobuf::internal::WireFormatLite::UInt64Size(&this->outputshape_);
  if (sVar2 != 0) {
    sVar3 = google::protobuf::internal::WireFormatLite::Int32Size((int32)sVar2);
    data_size = sVar3 + 1;
  }
  iVar1 = google::protobuf::internal::ToCachedSize(sVar2);
  this->_outputshape_cached_byte_size_ = iVar1;
  data_size = sVar2 + data_size;
  iVar4 = seed(this);
  if (iVar4 != 0) {
    iVar4 = seed(this);
    sVar2 = google::protobuf::internal::WireFormatLite::Int64Size(iVar4);
    data_size = sVar2 + 1 + data_size;
  }
  fVar5 = prob(this);
  if ((fVar5 != 0.0) || (NAN(fVar5))) {
    data_size = data_size + 5;
  }
  iVar1 = google::protobuf::internal::ToCachedSize(data_size);
  this->_cached_size_ = iVar1;
  return data_size;
}

Assistant:

size_t RandomBernoulliStaticLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.RandomBernoulliStaticLayerParams)
  size_t total_size = 0;

  // repeated uint64 outputShape = 3;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      UInt64Size(this->outputshape_);
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _outputshape_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // int64 seed = 1;
  if (this->seed() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int64Size(
        this->seed());
  }

  // float prob = 2;
  if (this->prob() != 0) {
    total_size += 1 + 4;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}